

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetworkXpan(Registry *this,uint64_t *aRet)

{
  Status SVar1;
  Network nwk;
  Network local_80;
  
  Network::Network(&local_80);
  SVar1 = GetCurrentNetwork(this,&local_80);
  if (SVar1 == kSuccess) {
    *aRet = local_80.mXpan;
  }
  Network::~Network(&local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetCurrentNetworkXpan(uint64_t &aRet)
{
    Registry::Status status;
    Network          nwk;
    VerifyOrExit(Registry::Status::kSuccess == (status = GetCurrentNetwork(nwk)));
    aRet = nwk.mXpan;
exit:
    return status;
}